

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native.c
# Opt level: O0

void unload_all(void)

{
  long lVar1;
  char *err;
  int i;
  
  for (err._4_4_ = 0; err._4_4_ < libCount; err._4_4_ = err._4_4_ + 1) {
    dlclose(libraries[err._4_4_].handle);
    lVar1 = dlerror();
    if (lVar1 != 0) {
      printf("\x1b[33m\n[Warning] %s\x1b[0m",lVar1);
    }
  }
  free(libraries);
  libCount = 0;
  libraries = (Library *)0x0;
  return;
}

Assistant:

void unload_all(){
    int i = 0;
    char *err = NULL;
    while(i < libCount){
        dlclose(libraries[i].handle);
        if((err = dlerror()) != NULL)
            printf(warning("%s"), err);
        i++;
    }
    memfree(libraries);
    libCount = 0;
    libraries = NULL;
}